

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::CodeGeneratorResponse_File::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar4;
  int line;
  Arena *pAVar5;
  Arena *arena;
  CodeGeneratorResponse_File *_this;
  CodeGeneratorResponse_File *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (CodeGeneratorResponse_File *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::compiler::CodeGeneratorResponse_File_const*,google::protobuf::compiler::CodeGeneratorResponse_File*>
                          ((CodeGeneratorResponse_File **)local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 1;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.name_,(string *)(uVar2 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 2) != 0) {
        pp_Var3 = from_msg[2]._vptr_MessageLite;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 2;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.insertion_point_,
                   (string *)((ulong)pp_Var3 & 0xfffffffffffffffc),pAVar5);
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = from_msg[2]._internal_metadata_.ptr_;
        (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
             (local_30->field_0)._impl_._has_bits_.has_bits_[0] | 4;
        pAVar5 = (Arena *)(local_30->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar5 & 1) != 0) {
          pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  (&(local_30->field_0)._impl_.content_,(string *)(uVar2 & 0xfffffffffffffffc),
                   pAVar5);
      }
      if ((uVar1 & 8) != 0) {
        from_msg_00 = (MessageLite *)from_msg[3]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.generated_code_info_ != nullptr";
          line = 0x56a;
          goto LAB_0012305f;
        }
        to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x20);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar4 = Arena::CopyConstruct<google::protobuf::GeneratedCodeInfo>(arena,from_msg_00);
          *(void **)((long)&local_30->field_0 + 0x20) = pvVar4;
        }
        else {
          GeneratedCodeInfo::MergeImpl(to_msg_00,from_msg_00);
        }
      }
    }
    (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_30->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  line = 0x55a;
LAB_0012305f:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void CodeGeneratorResponse_File::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse_File*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse_File&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_insertion_point(from._internal_insertion_point());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_content(from._internal_content());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.generated_code_info_ != nullptr);
      if (_this->_impl_.generated_code_info_ == nullptr) {
        _this->_impl_.generated_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.generated_code_info_);
      } else {
        _this->_impl_.generated_code_info_->MergeFrom(*from._impl_.generated_code_info_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}